

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ActivationParametricSoftplus::Clear(ActivationParametricSoftplus *this)

{
  Arena *pAVar1;
  ActivationParametricSoftplus *this_local;
  
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->alpha_ != (WeightParams *)0x0)) &&
     (this->alpha_ != (WeightParams *)0x0)) {
    (*(this->alpha_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->alpha_ = (WeightParams *)0x0;
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->beta_ != (WeightParams *)0x0)) &&
     (this->beta_ != (WeightParams *)0x0)) {
    (*(this->beta_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->beta_ = (WeightParams *)0x0;
  return;
}

Assistant:

void ActivationParametricSoftplus::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.ActivationParametricSoftplus)
  if (GetArenaNoVirtual() == NULL && alpha_ != NULL) {
    delete alpha_;
  }
  alpha_ = NULL;
  if (GetArenaNoVirtual() == NULL && beta_ != NULL) {
    delete beta_;
  }
  beta_ = NULL;
}